

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexMainWriter::writeMetaData(PtexMainWriter *this,FILE *fp)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  pointer pMVar3;
  MetaEntry *pMVar4;
  pointer data;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  __off_t _Var8;
  ulong uVar9;
  int i;
  ulong uVar10;
  ulong uVar11;
  uint8_t keysize;
  uint8_t datatype;
  uint32_t datasize;
  uint32_t zipsize;
  vector<Ptex::v2_2::PtexWriterBase::MetaEntry_*,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry_*>_>
  lmdEntries;
  vector<unsigned_int,_std::allocator<unsigned_int>_> lmdzipsize;
  vector<long,_std::allocator<long>_> lmdoffset;
  
  lmdEntries.
  super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry_*,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lmdEntries.
  super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry_*,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lmdEntries.
  super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry_*,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar11 = (ulong)((long)(this->super_PtexWriterBase)._metadata.
                         super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->super_PtexWriterBase)._metadata.
                        super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 6;
  uVar9 = 0;
  uVar10 = uVar11 & 0xffffffff;
  if ((int)uVar11 < 1) {
    uVar10 = uVar9;
  }
  for (; uVar10 * 0x40 != uVar9; uVar9 = uVar9 + 0x40) {
    pMVar3 = (this->super_PtexWriterBase)._metadata.
             super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar4 = (MetaEntry *)((long)&(pMVar3->key)._M_dataplus._M_p + uVar9);
    if (*(int *)((long)&(pMVar3->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                uVar9 + 8) -
        *(int *)((long)&(pMVar3->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                uVar9) < 0x401) {
      iVar5 = PtexWriterBase::writeMetaDataBlock(&this->super_PtexWriterBase,fp,pMVar4);
      puVar1 = &(this->super_PtexWriterBase)._header.metadatamemsize;
      *puVar1 = *puVar1 + iVar5;
    }
    else {
      lmdoffset.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pMVar4;
      std::
      vector<Ptex::v2_2::PtexWriterBase::MetaEntry*,std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry*>>
      ::emplace_back<Ptex::v2_2::PtexWriterBase::MetaEntry*>
                ((vector<Ptex::v2_2::PtexWriterBase::MetaEntry*,std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry*>>
                  *)&lmdEntries,(MetaEntry **)&lmdoffset);
    }
  }
  if ((this->super_PtexWriterBase)._header.metadatamemsize != 0) {
    uVar6 = PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,(void *)0x0,0,true);
    (this->super_PtexWriterBase)._header.metadatazipsize = uVar6;
  }
  PtexWriterBase::writeBlank(&this->super_PtexWriterBase,fp,8);
  uVar7 = (uint)((long)lmdEntries.
                       super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry_*,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)lmdEntries.
                       super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry_*,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (0 < (int)uVar7) {
    std::vector<long,_std::allocator<long>_>::vector
              (&lmdoffset,(ulong)(uVar7 & 0x7fffffff),(allocator_type *)&lmdzipsize);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&lmdzipsize,(ulong)(uVar7 & 0x7fffffff),(allocator_type *)&datasize);
    uVar9 = (ulong)(uVar7 & 0x7fffffff);
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      pMVar4 = lmdEntries.
               super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry_*,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10];
      _Var8 = ftello((FILE *)this->_tmpfp);
      lmdoffset.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar10] = _Var8;
      data = (pMVar4->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
      uVar7 = PtexWriterBase::writeZipBlock
                        (&this->super_PtexWriterBase,this->_tmpfp,data,
                         *(int *)&(pMVar4->data).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (int)data,true);
      lmdzipsize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10] = uVar7;
    }
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      pMVar4 = lmdEntries.
               super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry_*,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10];
      keysize = (char)(pMVar4->key)._M_string_length + '\x01';
      datatype = (uint8_t)pMVar4->datatype;
      datasize = *(int *)&(pMVar4->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(pMVar4->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
      zipsize = lmdzipsize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10];
      PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,&keysize,1,false);
      PtexWriterBase::writeZipBlock
                (&this->super_PtexWriterBase,fp,(pMVar4->key)._M_dataplus._M_p,(uint)keysize,false);
      PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,&datatype,1,false);
      PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,&datasize,4,false);
      PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,&zipsize,4,false);
      (this->super_PtexWriterBase)._extheader.lmdheadermemsize =
           (uint)keysize + (this->super_PtexWriterBase)._extheader.lmdheadermemsize + 10;
    }
    uVar6 = PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,(void *)0x0,0,true);
    (this->super_PtexWriterBase)._extheader.lmdheaderzipsize = uVar6;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      iVar5 = PtexWriterBase::copyBlock
                        (&this->super_PtexWriterBase,fp,this->_tmpfp,
                         lmdoffset.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10],
                         lmdzipsize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar10]);
      puVar2 = &(this->super_PtexWriterBase)._extheader.lmddatasize;
      *puVar2 = *puVar2 + (long)iVar5;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&lmdzipsize.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&lmdoffset.super__Vector_base<long,_std::allocator<long>_>);
  }
  std::
  _Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry_*,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry_*>_>
  ::~_Vector_base(&lmdEntries.
                   super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry_*,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry_*>_>
                 );
  return;
}

Assistant:

void PtexMainWriter::writeMetaData(FILE* fp)
{
    std::vector<MetaEntry*> lmdEntries; // large meta data items

    // write small meta data items in a single zip block
    for (int i = 0, n = (int)_metadata.size(); i < n; i++) {
        MetaEntry& e = _metadata[i];
#ifndef PTEX_NO_LARGE_METADATA_BLOCKS
        if (int(e.data.size()) > MetaDataThreshold) {
            // skip large items, but record for later
            lmdEntries.push_back(&e);
        }
        else
#endif
    {
            // add small item to zip block
            _header.metadatamemsize += writeMetaDataBlock(fp, e);
        }
    }
    if (_header.metadatamemsize) {
        // finish zip block
        _header.metadatazipsize = writeZipBlock(fp, 0, 0, /*finish*/ true);
    }

    // write compatibility barrier
    writeBlank(fp, sizeof(uint64_t));

    // write large items as separate blocks
    int nLmd = (int)lmdEntries.size();
    if (nLmd > 0) {
        // write data records to tmp file and accumulate zip sizes for lmd header
        std::vector<FilePos> lmdoffset(nLmd);
        std::vector<uint32_t> lmdzipsize(nLmd);
        for (int i = 0; i < nLmd; i++) {
            MetaEntry* e= lmdEntries[i];
            lmdoffset[i] = ftello(_tmpfp);
            lmdzipsize[i] = writeZipBlock(_tmpfp, &e->data[0], (int)e->data.size());
        }

        // write lmd header records as single zip block
        for (int i = 0; i < nLmd; i++) {
            MetaEntry* e = lmdEntries[i];
            uint8_t keysize = uint8_t(e->key.size()+1);
            uint8_t datatype = e->datatype;
            uint32_t datasize = (uint32_t)e->data.size();
            uint32_t zipsize = lmdzipsize[i];

            writeZipBlock(fp, &keysize, sizeof(keysize), false);
            writeZipBlock(fp, e->key.c_str(), keysize, false);
            writeZipBlock(fp, &datatype, sizeof(datatype), false);
            writeZipBlock(fp, &datasize, sizeof(datasize), false);
            writeZipBlock(fp, &zipsize, sizeof(zipsize), false);
            _extheader.lmdheadermemsize +=
                (uint32_t)(sizeof(keysize) + (size_t)keysize + sizeof(datatype) +
                           sizeof(datasize) + sizeof(zipsize));
        }
        _extheader.lmdheaderzipsize = writeZipBlock(fp, 0, 0, /*finish*/ true);

        // copy data records
        for (int i = 0; i < nLmd; i++) {
            _extheader.lmddatasize +=
                copyBlock(fp, _tmpfp, lmdoffset[i], lmdzipsize[i]);
        }
    }
}